

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::SimpleGlob
               (string *glob,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,int type)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  __type local_1f3;
  bool local_1aa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined4 local_148;
  allocator local_141;
  string local_140 [8];
  string sfname;
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  uint local_ac;
  uint i;
  Directory d;
  string local_98 [7];
  bool res;
  undefined1 local_68 [8];
  string ppath;
  string path;
  int type_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *glob_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(files);
  std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)glob);
  if (*pcVar2 == '*') {
    cmsys::SystemTools::GetFilenamePath((string *)((long)&ppath.field_2 + 8),glob);
    cmsys::SystemTools::GetFilenameName((string *)local_68,glob);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_68);
    std::__cxx11::string::operator=((string *)local_68,local_98);
    std::__cxx11::string::~string(local_98);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)(ppath.field_2._M_local_buf + 8),"/");
    }
    d.Internal._7_1_ = 0;
    cmsys::Directory::Directory((Directory *)&stack0xffffffffffffff58);
    bVar1 = cmsys::Directory::Load
                      ((Directory *)&stack0xffffffffffffff58,(string *)((long)&ppath.field_2 + 8));
    if (bVar1) {
      for (local_ac = 0; uVar3 = (ulong)local_ac,
          uVar4 = cmsys::Directory::GetNumberOfFiles((Directory *)&stack0xffffffffffffff58),
          uVar3 < uVar4; local_ac = local_ac + 1) {
        fname.field_2._M_local_buf[0xe] = '\0';
        fname.field_2._M_local_buf[0xd] = '\0';
        pcVar2 = cmsys::Directory::GetFile((Directory *)&stack0xffffffffffffff58,(ulong)local_ac);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d0,pcVar2,&local_d1);
        bVar1 = std::operator!=(&local_d0,".");
        local_1aa = false;
        if (bVar1) {
          pcVar2 = cmsys::Directory::GetFile((Directory *)&stack0xffffffffffffff58,(ulong)local_ac);
          std::allocator<char>::allocator();
          fname.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string
                    ((string *)&local_f8,pcVar2,(allocator *)(fname.field_2._M_local_buf + 0xf));
          fname.field_2._M_local_buf[0xd] = '\x01';
          local_1aa = std::operator!=(&local_f8,"..");
        }
        if ((fname.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_f8);
        }
        if ((fname.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
        }
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        if (local_1aa != false) {
          std::__cxx11::string::string
                    ((string *)(sfname.field_2._M_local_buf + 8),
                     (string *)(ppath.field_2._M_local_buf + 8));
          std::__cxx11::string::size();
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)((long)&ppath.field_2 + 8));
          if (*pcVar2 != '/') {
            std::__cxx11::string::operator+=((string *)(sfname.field_2._M_local_buf + 8),"/");
          }
          pcVar2 = cmsys::Directory::GetFile((Directory *)&stack0xffffffffffffff58,(ulong)local_ac);
          std::__cxx11::string::operator+=((string *)(sfname.field_2._M_local_buf + 8),pcVar2);
          pcVar2 = cmsys::Directory::GetFile((Directory *)&stack0xffffffffffffff58,(ulong)local_ac);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_140,pcVar2,&local_141);
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
          if ((type < 1) ||
             (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&sfname.field_2 + 8)),
             !bVar1)) {
            if ((-1 < type) ||
               (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&sfname.field_2 + 8)),
               bVar1)) {
              uVar3 = std::__cxx11::string::size();
              uVar5 = std::__cxx11::string::size();
              local_1f3 = false;
              if (uVar5 <= uVar3) {
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)&local_168,(ulong)local_140);
                local_1f3 = std::operator==(&local_168,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_68);
                std::__cxx11::string::~string((string *)&local_168);
              }
              if (local_1f3 != false) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(files,(value_type *)((long)&sfname.field_2 + 8));
                d.Internal._7_1_ = 1;
              }
              local_148 = 0;
            }
            else {
              local_148 = 4;
            }
          }
          else {
            local_148 = 4;
          }
          std::__cxx11::string::~string(local_140);
          std::__cxx11::string::~string((string *)(sfname.field_2._M_local_buf + 8));
        }
      }
    }
    glob_local._7_1_ = (bool)(d.Internal._7_1_ & 1);
    local_148 = 1;
    cmsys::Directory::~Directory((Directory *)&stack0xffffffffffffff58);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(ppath.field_2._M_local_buf + 8));
  }
  else {
    glob_local._7_1_ = false;
  }
  return glob_local._7_1_;
}

Assistant:

bool cmSystemTools::SimpleGlob(const std::string& glob,
                               std::vector<std::string>& files,
                               int type /* = 0 */)
{
  files.clear();
  if (glob[glob.size() - 1] != '*') {
    return false;
  }
  std::string path = cmSystemTools::GetFilenamePath(glob);
  std::string ppath = cmSystemTools::GetFilenameName(glob);
  ppath = ppath.substr(0, ppath.size() - 1);
  if (path.empty()) {
    path = "/";
  }

  bool res = false;
  cmsys::Directory d;
  if (d.Load(path)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = path;
        if (path[path.size() - 1] != '/') {
          fname += "/";
        }
        fname += d.GetFile(i);
        std::string sfname = d.GetFile(i);
        if (type > 0 && cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (type < 0 && !cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (sfname.size() >= ppath.size() &&
            sfname.substr(0, ppath.size()) == ppath) {
          files.push_back(fname);
          res = true;
        }
      }
    }
  }
  return res;
}